

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_id.c
# Opt level: O3

int mpt_message_id2buf(uint64_t id,void *ptr,size_t len)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (len == 0) {
    iVar2 = -0x11;
    if (id == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  *(char *)((long)ptr + (len - 1)) = (char)id;
  iVar2 = 1;
  uVar3 = id;
  if (len != 1) {
    do {
      id = uVar3 >> 8;
      iVar2 = (iVar2 + 1) - (uint)(uVar3 < 0x100);
      *(char *)((long)ptr + (len - 2)) = (char)(uVar3 >> 8);
      len = len - 1;
      uVar3 = id;
    } while (len != 1);
  }
  if (id == 0) {
    iVar1 = -2;
    if (-1 < *ptr) {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  return -0x11;
}

Assistant:

int mpt_message_id2buf(uint64_t id, void *ptr, size_t len)
{
	uint8_t *buf = ptr;
	int used;
	if (!len--) {
		return id ? MPT_ERROR(MissingBuffer) : 0;
	}
	buf[len] = 0xff & id;
	used = 1;
	while (len--) {
		id /= 0x100;
		if (id) ++used;
		buf[len] = 0xff & id;
	}
	if (id) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((*buf & 0x80)) {
		return MPT_ERROR(BadValue);
	}
	return used;
}